

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.cpp
# Opt level: O0

void embree::parseComments(Ref<embree::Stream<embree::Token>_> *cin)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ParseLocation *__rhs;
  undefined8 in_RDI;
  Token *in_stack_fffffffffffffd98;
  Token *in_stack_fffffffffffffda0;
  undefined7 in_stack_fffffffffffffdf8;
  undefined1 in_stack_fffffffffffffdff;
  Token local_200;
  ParseLocation *in_stack_fffffffffffffe48;
  Stream<embree::Token> *in_stack_fffffffffffffe58;
  Stream<embree::Token> *in_stack_fffffffffffffe60;
  string local_198 [111];
  allocator local_129;
  string local_128 [127];
  allocator local_a9;
  string local_a8 [104];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_40 = in_RDI;
  do {
    local_8 = local_40;
    Stream<embree::Token>::peek(in_stack_fffffffffffffe58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a8,"<!--",&local_a9);
    Token::Sym((string *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
    bVar1 = operator==(in_stack_fffffffffffffd98,(Token *)0x41b70a);
    Token::~Token(in_stack_fffffffffffffda0);
    std::__cxx11::string::~string(local_a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_a9);
    if (!bVar1) {
      return;
    }
    local_10 = local_40;
    Stream<embree::Token>::drop(in_stack_fffffffffffffe58);
    while( true ) {
      local_18 = local_40;
      Stream<embree::Token>::peek(in_stack_fffffffffffffe58);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_128,"-->",&local_129);
      Token::Sym((string *)CONCAT17(in_stack_fffffffffffffdff,in_stack_fffffffffffffdf8));
      bVar1 = operator!=(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      Token::~Token(in_stack_fffffffffffffda0);
      std::__cxx11::string::~string(local_128);
      std::allocator<char>::~allocator((allocator<char> *)&local_129);
      if (!bVar1) break;
      local_20 = local_40;
      Stream<embree::Token>::peek(in_stack_fffffffffffffe58);
      Token::Eof();
      bVar1 = operator==(in_stack_fffffffffffffd98,(Token *)0x41b85f);
      Token::~Token(in_stack_fffffffffffffda0);
      if (bVar1) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                __cxa_allocate_exception(0x10);
        local_28 = local_40;
        Stream<embree::Token>::get(in_stack_fffffffffffffe60);
        __rhs = Token::Location(&local_200);
        ParseLocation::str_abi_cxx11_(in_stack_fffffffffffffe48);
        std::operator+(__lhs,(char *)__rhs);
        std::runtime_error::runtime_error((runtime_error *)__lhs,local_198);
        __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      local_30 = local_40;
      Stream<embree::Token>::drop(in_stack_fffffffffffffe58);
    }
    local_38 = local_40;
    Stream<embree::Token>::drop(in_stack_fffffffffffffe58);
  } while( true );
}

Assistant:

void parseComments(Ref<Stream<Token> >& cin)
  {
    while (cin->peek() == Token::Sym("<!--")) {
      cin->drop();
      while (cin->peek() != Token::Sym("-->")) {
        if (cin->peek() == Token::Eof())
          THROW_RUNTIME_ERROR(cin->get().Location().str()+": --> expected");
        cin->drop();
      }
      cin->drop();
    }
  }